

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O2

void __thiscall bloom_tests::merkle_block_1::test_method(merkle_block_1 *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  pair<unsigned_int,_uint256> *ppVar6;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  Span<const_unsigned_char> vKey;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> vKey_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  base_blob<256u> *this_00;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  assertion_result local_480;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  CBloomFilter filter;
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  assertion_result *apaStack_2a0 [21];
  pair<unsigned_int,_uint256> pair;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_198;
  undefined1 local_188 [8];
  element_type *local_180;
  shared_count sStack_178;
  assertion_result *local_170;
  CMerkleBlock merkleBlock;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  getBlock13b8a();
  CBloomFilter::CBloomFilter(&filter,10,1e-06,0,'\x01');
  merkleBlock.header.nVersion = -0x78bae0e0;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0xec;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0x86;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xb5;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0x82;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0x97;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xed;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xc2;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 0xdd;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '2';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0xd6;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0xfc;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0xd9;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0x98;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 0xaa;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = 'y';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 'C';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\b';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0xaa;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 200;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\x02';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = 0xa8;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0xaf;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = ';';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 0xe0;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = 0xe0;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = 0x81;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xd6;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = 't';
  vKey.m_size = 0x20;
  vKey.m_data = (uchar *)&merkleBlock;
  CBloomFilter::insert(&filter,vKey);
  CMerkleBlock::CMerkleBlock(&merkleBlock,&block,&filter);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xb5;
  file.m_begin = (iterator)&local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_300,msg);
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  apaStack_2a0[0] = (assertion_result *)0xc694e1;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_308 = "";
  CBlockHeader::GetHash((uint256 *)local_188,&merkleBlock.header);
  this_00 = (base_blob<256u> *)local_188;
  base_blob<256u>::GetHex_abi_cxx11_((string *)&pair,this_00);
  CBlockHeader::GetHash((uint256 *)&vMatched,&block.super_CBlockHeader);
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_1a8,(base_blob<256u> *)&vMatched);
  pvVar5 = (iterator)0x2;
  ppVar6 = &pair;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_2b8,&local_310,0xb5,1,2,ppVar6,"merkleBlock.header.GetHash().GetHex()",
             (string *)local_1a8,"block.GetHash().GetHex()");
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&pair);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)ppVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0xb7;
  file_00.m_begin = (iterator)&local_320;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_330,
             msg_00);
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  apaStack_2a0[0] = (assertion_result *)0xc694e1;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_338 = "";
  pair._0_8_ = ((long)merkleBlock.vMatchedTxn.
                      super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)merkleBlock.vMatchedTxn.
                     super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x24;
  ppVar6 = &pair;
  local_188._0_4_ = 1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_2b8,&local_340,0xb7,1,2,ppVar6,"merkleBlock.vMatchedTxn.size()",this_00,"1U");
  pair.first = (merkleBlock.vMatchedTxn.
                super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first;
  pair.second.super_base_blob<256U>.m_data._M_elems[0] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [0];
  pair.second.super_base_blob<256U>.m_data._M_elems[1] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [1];
  pair.second.super_base_blob<256U>.m_data._M_elems[2] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [2];
  pair.second.super_base_blob<256U>.m_data._M_elems[3] =
       ((merkleBlock.vMatchedTxn.
         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
       [3];
  pair.second.super_base_blob<256U>.m_data._M_elems._4_8_ =
       *(undefined8 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 4);
  pair.second.super_base_blob<256U>.m_data._M_elems._12_8_ =
       *(undefined8 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 0xc);
  pair.second.super_base_blob<256U>.m_data._M_elems._20_8_ =
       *(undefined8 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 0x14);
  pair.second.super_base_blob<256U>.m_data._M_elems._28_4_ =
       *(undefined4 *)
        (((merkleBlock.vMatchedTxn.
           super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>.m_data._M_elems
        + 0x1c);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)ppVar6;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0xba;
  file_01.m_begin = (iterator)&local_350;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_360,
             msg_01);
  local_2b8._0_8_ = (_func_int **)0x82b586ec87451f20;
  local_2b8._8_8_ = 0xd9fcd632ddc2ed97;
  local_2a8._0_1_ = 0x98;
  local_2a8._1_1_ = 0xaa;
  local_2a8._2_1_ = 'y';
  local_2a8._3_1_ = 'C';
  local_2a8._4_1_ = '\b';
  local_2a8._5_1_ = 0xaa;
  local_2a8._6_1_ = 200;
  local_2a8._7_1_ = '\x02';
  apaStack_2a0[0] = (assertion_result *)0x74d681e0e03bafa8;
  bVar2 = ::operator==(&((merkleBlock.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>,
                       (base_blob<256U> *)local_2b8);
  local_1a8[0] = bVar2;
  local_1a8._8_8_ = (element_type *)0x0;
  aStack_198._M_allocated_capacity = 0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_3d55a6;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb65ade;
  local_180 = (element_type *)((ulong)local_180 & 0xffffffffffffff00);
  local_188 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_178.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_368 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_170 = (assertion_result *)&vMatched;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,0,WARN,(check_type)this_00,
             (size_t)&local_370,0xba);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_198._M_allocated_capacity);
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0xbb;
  file_02.m_begin = (iterator)&local_380;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_390,
             msg_02);
  local_188[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((merkleBlock.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first == 8);
  local_180 = (element_type *)0x0;
  sStack_178.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "merkleBlock.vMatchedTxn[0].first == 8";
  local_1a8._8_8_ = "";
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_398 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  apaStack_2a0[0] = (assertion_result *)local_1a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2b8,1,0,WARN,(check_type)this_00,
             (size_t)&local_3a0,0xbb);
  boost::detail::shared_count::~shared_count(&sStack_178);
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0xbf;
  file_03.m_begin = (iterator)&local_3c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3d8,
             msg_03);
  CPartialMerkleTree::ExtractMatches((uint256 *)local_2b8,&merkleBlock.txn,&vMatched,&vIndex);
  bVar2 = ::operator==((base_blob<256U> *)local_2b8,
                       &block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>);
  local_1a8[0] = bVar2;
  local_1a8._8_8_ = (element_type *)0x0;
  aStack_198._M_allocated_capacity = 0;
  local_170 = &local_480;
  local_480._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_480.m_message.px = (element_type *)0xb65b4d;
  local_180 = (element_type *)((ulong)local_180 & 0xffffffffffffff00);
  local_188 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_178.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3e0 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,0,WARN,(check_type)this_00,
             (size_t)&local_3e8,0xbf);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_198._M_allocated_capacity);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0xc0;
  file_04.m_begin = (iterator)&local_3f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_408,
             msg_04);
  local_188[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5 ==
                 ((long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  local_180 = (element_type *)0x0;
  sStack_178.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_1a8._8_8_ = "";
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  apaStack_2a0[0] = (assertion_result *)local_1a8;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_410 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2b8,1,0,WARN,(check_type)this_00,
             (size_t)&local_418,0xc0);
  boost::detail::shared_count::~shared_count(&sStack_178);
  for (uVar3 = 0; uVar4 = (ulong)uVar3,
      uVar4 < (ulong)((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    local_428 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_420 = "";
    local_438 = &boost::unit_test::basic_cstring<char_const>::null;
    local_430 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar7;
    msg_05.m_begin = pvVar5;
    file_05.m_end = (iterator)0xc2;
    file_05.m_begin = (iterator)&local_428;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_438,
               msg_05);
    bVar2 = ::operator==(&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4].super_base_blob<256U>,
                         &merkleBlock.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4].second.
                          super_base_blob<256U>);
    local_188[0] = (class_property<bool>)(class_property<bool>)bVar2;
    local_180 = (element_type *)0x0;
    sStack_178.pi_ = (sp_counted_base *)0x0;
    local_1a8._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
    local_1a8._8_8_ = "";
    local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
    local_2b8._0_8_ = &PTR__lazy_ostream_0113a070;
    local_2a8 = boost::unit_test::lazy_ostream::inst;
    apaStack_2a0[0] = (assertion_result *)local_1a8;
    local_448 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_440 = "";
    pvVar5 = &DAT_00000001;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_188,(lazy_ostream *)local_2b8,1,0,WARN,(check_type)this_00,
               (size_t)&local_448,0xc2);
    boost::detail::shared_count::~shared_count(&sStack_178);
  }
  local_2b8._0_8_ = (_func_int **)0xf168809cdfae1053;
  local_2b8._8_8_ = 0x7f4f728691ac62e8;
  local_2a8._0_1_ = 0xde;
  local_2a8._1_1_ = 0xdb;
  local_2a8._2_1_ = '\n';
  local_2a8._3_1_ = 0xa9;
  local_2a8._4_1_ = 0x81;
  local_2a8._5_1_ = 0x98;
  local_2a8._6_1_ = '3';
  local_2a8._7_1_ = 0xaf;
  apaStack_2a0[0] = (assertion_result *)0xdd1fd2a6fc16404f;
  vKey_00.m_size = 0x20;
  vKey_00.m_data = local_2b8;
  CBloomFilter::insert(&filter,vKey_00);
  CMerkleBlock::CMerkleBlock((CMerkleBlock *)local_2b8,&block,&filter);
  CMerkleBlock::operator=(&merkleBlock,(CMerkleBlock *)local_2b8);
  CMerkleBlock::~CMerkleBlock((CMerkleBlock *)local_2b8);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0xc7;
  file_06.m_begin = (iterator)&local_458;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_468,
             msg_06);
  CBlockHeader::GetHash((uint256 *)local_2b8,&merkleBlock.header);
  CBlockHeader::GetHash((uint256 *)local_188,&block.super_CBlockHeader);
  bVar2 = ::operator==((base_blob<256U> *)local_2b8,(base_blob<256U> *)local_188);
  local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_480.m_message.px = (element_type *)0x0;
  local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
  aStack_198._8_8_ = &local_490;
  local_490 = "merkleBlock.header.GetHash() == block.GetHash()";
  local_488 = "";
  local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
  local_1a8._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_198._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_498 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_480,(lazy_ostream *)local_1a8,1,0,WARN,(check_type)this_00,(size_t)&local_4a0,
             199);
  boost::detail::shared_count::~shared_count(&local_480.m_message.pn);
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar5;
  file_07.m_end = (iterator)0xc9;
  file_07.m_begin = (iterator)&local_4b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4c0,
             msg_07);
  local_180 = (element_type *)0x0;
  sStack_178.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "merkleBlock.vMatchedTxn.size() == 2";
  local_1a8._8_8_ = "";
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_4c8 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  apaStack_2a0[0] = (assertion_result *)local_1a8;
  local_188[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x48);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2b8,1,0,WARN,(check_type)this_00,
             (size_t)&local_4d0,0xc9);
  boost::detail::shared_count::~shared_count(&sStack_178);
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar5;
  file_08.m_end = (iterator)0xcb;
  file_08.m_begin = (iterator)&local_4e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4f0,
             msg_08);
  local_188[0] = (class_property<bool>)
                 std::operator==(merkleBlock.vMatchedTxn.
                                 super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1,&pair);
  local_180 = (element_type *)0x0;
  sStack_178.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "merkleBlock.vMatchedTxn[1] == pair";
  local_1a8._8_8_ = "";
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_4f8 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  apaStack_2a0[0] = (assertion_result *)local_1a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2b8,1,0,WARN,(check_type)this_00,
             (size_t)&local_500,0xcb);
  boost::detail::shared_count::~shared_count(&sStack_178);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar5;
  file_09.m_end = (iterator)0xcd;
  file_09.m_begin = (iterator)&local_510;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_520,
             msg_09);
  local_2b8._0_8_ = (_func_int **)0xf168809cdfae1053;
  local_2b8._8_8_ = 0x7f4f728691ac62e8;
  local_2a8._0_1_ = 0xde;
  local_2a8._1_1_ = 0xdb;
  local_2a8._2_1_ = '\n';
  local_2a8._3_1_ = 0xa9;
  local_2a8._4_1_ = 0x81;
  local_2a8._5_1_ = 0x98;
  local_2a8._6_1_ = '3';
  local_2a8._7_1_ = 0xaf;
  apaStack_2a0[0] = (assertion_result *)0xdd1fd2a6fc16404f;
  bVar2 = ::operator==(&((merkleBlock.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>,
                       (base_blob<256U> *)local_2b8);
  local_1a8[0] = bVar2;
  local_1a8._8_8_ = (element_type *)0x0;
  aStack_198._M_allocated_capacity = 0;
  local_480._0_8_ =
       "merkleBlock.vMatchedTxn[0].second == uint256{\"dd1fd2a6fc16404faf339881a90adbde7f4f728691ac62e8f168809cdfae1053\"}"
  ;
  local_480.m_message.px = (element_type *)0xb65c98;
  local_180 = (element_type *)((ulong)local_180 & 0xffffffffffffff00);
  local_188 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_178.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_528 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_170 = &local_480;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,0,WARN,(check_type)this_00,
             (size_t)&local_530,0xcd);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_198._M_allocated_capacity);
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar5;
  file_10.m_end = (iterator)0xce;
  file_10.m_begin = (iterator)&local_540;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_550,
             msg_10);
  local_188[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((merkleBlock.vMatchedTxn.
                   super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first == 7);
  local_180 = (element_type *)0x0;
  sStack_178.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "merkleBlock.vMatchedTxn[0].first == 7";
  local_1a8._8_8_ = "";
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_558 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  apaStack_2a0[0] = (assertion_result *)local_1a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2b8,1,0,WARN,(check_type)this_00,
             (size_t)&local_560,0xce);
  boost::detail::shared_count::~shared_count(&sStack_178);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar5;
  file_11.m_end = (iterator)0xd0;
  file_11.m_begin = (iterator)&local_570;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_580,
             msg_11);
  CPartialMerkleTree::ExtractMatches((uint256 *)local_2b8,&merkleBlock.txn,&vMatched,&vIndex);
  bVar2 = ::operator==((base_blob<256U> *)local_2b8,
                       &block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>);
  local_1a8[0] = bVar2;
  local_1a8._8_8_ = (element_type *)0x0;
  aStack_198._M_allocated_capacity = 0;
  local_480._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_480.m_message.px = (element_type *)0xb65b4d;
  local_180 = (element_type *)((ulong)local_180 & 0xffffffffffffff00);
  local_188 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_178.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_588 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_170 = &local_480;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,0,WARN,(check_type)this_00,
             (size_t)&local_590,0xd0);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_198._M_allocated_capacity);
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar7;
  msg_12.m_begin = pvVar5;
  file_12.m_end = (iterator)0xd1;
  file_12.m_begin = (iterator)&local_5a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_5b0,
             msg_12);
  local_188[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5 ==
                 ((long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  local_180 = (element_type *)0x0;
  sStack_178.pi_ = (sp_counted_base *)0x0;
  local_1a8._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_1a8._8_8_ = "";
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  apaStack_2a0[0] = (assertion_result *)local_1a8;
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_5b8 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_2b8,1,0,WARN,(check_type)this_00,
             (size_t)&local_5c0,0xd1);
  boost::detail::shared_count::~shared_count(&sStack_178);
  for (uVar3 = 0; uVar4 = (ulong)uVar3,
      uVar4 < (ulong)((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    local_5d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_5c8 = "";
    local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar7;
    msg_13.m_begin = pvVar5;
    file_13.m_end = (iterator)0xd3;
    file_13.m_begin = (iterator)&local_5d0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5e0,
               msg_13);
    bVar2 = ::operator==(&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4].super_base_blob<256U>,
                         &merkleBlock.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4].second.
                          super_base_blob<256U>);
    local_188[0] = (class_property<bool>)(class_property<bool>)bVar2;
    local_180 = (element_type *)0x0;
    sStack_178.pi_ = (sp_counted_base *)0x0;
    local_1a8._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
    local_1a8._8_8_ = "";
    local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
    local_2b8._0_8_ = &PTR__lazy_ostream_0113a070;
    local_2a8 = boost::unit_test::lazy_ostream::inst;
    apaStack_2a0[0] = (assertion_result *)local_1a8;
    local_5f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_5e8 = "";
    pvVar5 = &DAT_00000001;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_188,(lazy_ostream *)local_2b8,1,0,WARN,(check_type)this_00,
               (size_t)&local_5f0,0xd3);
    boost::detail::shared_count::~shared_count(&sStack_178);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>);
  CMerkleBlock::~CMerkleBlock(&merkleBlock);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&filter);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_1)
{
    CBlock block = getBlock13b8a();
    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // Match the last transaction
    filter.insert(uint256{"74d681e0e03bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK_EQUAL(merkleBlock.header.GetHash().GetHex(), block.GetHash().GetHex());

    BOOST_CHECK_EQUAL(merkleBlock.vMatchedTxn.size(), 1U);
    std::pair<unsigned int, uint256> pair = merkleBlock.vMatchedTxn[0];

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"74d681e0e03bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 8);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    // Also match the 8th transaction
    filter.insert(uint256{"dd1fd2a6fc16404faf339881a90adbde7f4f728691ac62e8f168809cdfae1053"});
    merkleBlock = CMerkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 2);

    BOOST_CHECK(merkleBlock.vMatchedTxn[1] == pair);

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"dd1fd2a6fc16404faf339881a90adbde7f4f728691ac62e8f168809cdfae1053"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 7);

    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);
}